

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O1

void __thiscall
chrono::ChVector<double>::DirToDxDyDz
          (ChVector<double> *this,ChVector<double> *Vx,ChVector<double> *Vy,ChVector<double> *Vz,
          ChVector<double> *Vsingular)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  dVar18 = this->m_data[0];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar18;
  dVar1 = this->m_data[1];
  if ((((dVar18 != 0.0) || (NAN(dVar18))) || (dVar1 != 0.0)) ||
     (((NAN(dVar1) || (this->m_data[2] != 0.0)) || (NAN(this->m_data[2]))))) {
    dVar2 = this->m_data[2];
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar2;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar1 * dVar1;
    auVar16 = vfmadd231sd_fma(auVar19,auVar16,auVar16);
    auVar16 = vfmadd231sd_fma(auVar16,auVar38,auVar38);
    if (auVar16._0_8_ < 0.0) {
      dVar17 = sqrt(auVar16._0_8_);
    }
    else {
      auVar16 = vsqrtsd_avx(auVar16,auVar16);
      dVar17 = auVar16._0_8_;
    }
    bVar15 = 2.2250738585072014e-308 <= dVar17;
    dVar17 = 1.0 / dVar17;
    Vx->m_data[0] =
         (double)((ulong)bVar15 * (long)(dVar18 * dVar17) + (ulong)!bVar15 * 0x3ff0000000000000);
    Vx->m_data[1] = (double)((ulong)bVar15 * (long)(dVar1 * dVar17));
    Vx->m_data[2] = (double)((ulong)bVar15 * (long)(dVar2 * dVar17));
  }
  else {
    Vx->m_data[0] = 1.0;
    Vx->m_data[1] = 0.0;
    Vx->m_data[2] = 0.0;
  }
  auVar20._8_8_ = 0;
  auVar20._0_8_ = Vx->m_data[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = Vsingular->m_data[2];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = Vsingular->m_data[1] * Vx->m_data[2];
  auVar16 = vfmsub231sd_fma(auVar31,auVar20,auVar3);
  Vz->m_data[0] = auVar16._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = Vx->m_data[2];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = Vsingular->m_data[0];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = Vsingular->m_data[2] * Vx->m_data[0];
  auVar19 = vfmsub231sd_fma(auVar35,auVar21,auVar4);
  dVar18 = auVar19._0_8_;
  Vz->m_data[1] = dVar18;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = Vx->m_data[0];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = Vsingular->m_data[1];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = Vsingular->m_data[0] * Vx->m_data[1];
  auVar19 = vfmsub231sd_fma(auVar37,auVar22,auVar5);
  Vz->m_data[2] = auVar19._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar18 * dVar18;
  auVar16 = vfmadd231sd_fma(auVar23,auVar16,auVar16);
  auVar16 = vfmadd231sd_fma(auVar16,auVar19,auVar19);
  if (auVar16._0_8_ < 0.0) {
    dVar18 = sqrt(auVar16._0_8_);
  }
  else {
    auVar16 = vsqrtsd_avx(auVar16,auVar16);
    dVar18 = auVar16._0_8_;
  }
  if (0.0001 <= dVar18) goto LAB_005fb0d9;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = Vsingular->m_data[0];
  auVar12._8_8_ = 0x7fffffffffffffff;
  auVar12._0_8_ = 0x7fffffffffffffff;
  auVar16 = vandpd_avx512vl(auVar24,auVar12);
  if (0.9 <= auVar16._0_8_) {
    auVar25._8_8_ = 0;
    auVar25._0_8_ = Vsingular->m_data[1];
    auVar13._8_8_ = 0x7fffffffffffffff;
    auVar13._0_8_ = 0x7fffffffffffffff;
    auVar16 = vandpd_avx512vl(auVar25,auVar13);
    if (0.9 <= auVar16._0_8_) {
      auVar26._8_8_ = 0;
      auVar26._0_8_ = Vsingular->m_data[2];
      auVar14._8_8_ = 0x7fffffffffffffff;
      auVar14._0_8_ = 0x7fffffffffffffff;
      auVar16 = vandpd_avx512vl(auVar26,auVar14);
      auVar19 = ZEXT816(0);
      if (0.9 <= auVar16._0_8_) goto LAB_005fb07f;
      auVar16 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar19 = ZEXT816(0x3ff0000000000000);
LAB_005fb07f:
      auVar16 = ZEXT816(0);
    }
    auVar38 = ZEXT816(0) << 0x40;
  }
  else {
    auVar38 = ZEXT816(0x3ff0000000000000);
    auVar16 = ZEXT816(0);
    auVar19 = ZEXT816(0) << 0x40;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = Vx->m_data[1];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auVar19._0_8_ * Vx->m_data[2];
  auVar3 = vfmsub231sd_fma(auVar40,auVar16,auVar6);
  Vz->m_data[0] = auVar3._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = Vx->m_data[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar16._0_8_ * Vx->m_data[0];
  auVar16 = vfmsub231sd_fma(auVar36,auVar38,auVar7);
  dVar18 = auVar16._0_8_;
  Vz->m_data[1] = dVar18;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = Vx->m_data[0];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = auVar38._0_8_ * Vx->m_data[1];
  auVar19 = vfmsub231sd_fma(auVar39,auVar19,auVar8);
  Vz->m_data[2] = auVar19._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar18 * dVar18;
  auVar16 = vfmadd231sd_fma(auVar27,auVar3,auVar3);
  auVar16 = vfmadd231sd_fma(auVar16,auVar19,auVar19);
  if (auVar16._0_8_ < 0.0) {
    dVar18 = sqrt(auVar16._0_8_);
  }
  else {
    auVar16 = vsqrtsd_avx(auVar16,auVar16);
    dVar18 = auVar16._0_8_;
  }
LAB_005fb0d9:
  dVar18 = 1.0 / dVar18;
  Vz->m_data[0] = dVar18 * Vz->m_data[0];
  dVar1 = dVar18 * Vz->m_data[1];
  Vz->m_data[1] = dVar1;
  dVar18 = dVar18 * Vz->m_data[2];
  Vz->m_data[2] = dVar18;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = Vx->m_data[2];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar18 * Vx->m_data[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1;
  auVar16 = vfmsub231sd_fma(auVar28,auVar32,auVar9);
  Vy->m_data[0] = auVar16._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = Vz->m_data[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = Vx->m_data[0];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = Vx->m_data[2] * Vz->m_data[0];
  auVar16 = vfmsub231sd_fma(auVar33,auVar29,auVar10);
  Vy->m_data[1] = auVar16._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = Vz->m_data[0];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = Vx->m_data[1];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = Vx->m_data[0] * Vz->m_data[1];
  auVar16 = vfmsub231sd_fma(auVar34,auVar30,auVar11);
  Vy->m_data[2] = auVar16._0_8_;
  return;
}

Assistant:

inline void ChVector<Real>::DirToDxDyDz(ChVector<Real>& Vx,
                                        ChVector<Real>& Vy,
                                        ChVector<Real>& Vz,
                                        const ChVector<Real>& Vsingular) const {
    // set Vx.
    if (this->IsNull())
        Vx = ChVector<Real>(1, 0, 0);
    else
        Vx = this->GetNormalized();

    Vz.Cross(Vx, Vsingular);
    Real zlen = Vz.Length();

    // if near singularity, change the singularity reference vector.
    if (zlen < 0.0001) {
        ChVector<Real> mVsingular;

        if (std::abs(Vsingular.m_data[0]) < 0.9)
            mVsingular = ChVector<Real>(1, 0, 0);
        else if (std::abs(Vsingular.m_data[1]) < 0.9)
            mVsingular = ChVector<Real>(0, 1, 0);
        else if (std::abs(Vsingular.m_data[2]) < 0.9)
            mVsingular = ChVector<Real>(0, 0, 1);

        Vz.Cross(Vx, mVsingular);
        zlen = Vz.Length();  // now should be nonzero length.
    }

    // normalize Vz.
    Vz.Scale(1 / zlen);

    // compute Vy.
    Vy.Cross(Vz, Vx);
}